

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

PragmaDirectiveSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::PragmaDirectiveSyntax,slang::parsing::Token&,slang::parsing::Token&,std::span<slang::syntax::TokenOrSyntax,18446744073709551615ul>>
          (BumpAllocator *this,Token *args,Token *args_1,
          span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *args_2)

{
  Token directive;
  Token name;
  PragmaDirectiveSyntax *this_00;
  SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> local_58;
  
  this_00 = (PragmaDirectiveSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((PragmaDirectiveSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (PragmaDirectiveSyntax *)allocateSlow(this,0x70,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  directive.kind = args->kind;
  directive._2_1_ = args->field_0x2;
  directive.numFlags.raw = (args->numFlags).raw;
  directive.rawLen = args->rawLen;
  directive.info = args->info;
  name.kind = args_1->kind;
  name._2_1_ = args_1->field_0x2;
  name.numFlags.raw = (args_1->numFlags).raw;
  name.rawLen = args_1->rawLen;
  name.info = args_1->info;
  local_58.elements._M_ptr = args_2->_M_ptr;
  local_58.super_SyntaxListBase.childCount = (args_2->_M_extent)._M_extent_value;
  local_58.super_SyntaxListBase.super_SyntaxNode.kind = SeparatedList;
  local_58.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_58.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_58.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005d2588;
  local_58.elements._M_extent._M_extent_value = local_58.super_SyntaxListBase.childCount;
  slang::syntax::PragmaDirectiveSyntax::PragmaDirectiveSyntax(this_00,directive,name,&local_58);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }